

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pools.cpp
# Opt level: O2

void __thiscall xmrig::Pools::load(Pools *this,IJsonReader *reader)

{
  int iVar1;
  undefined4 extraout_var;
  long lVar3;
  Value *object;
  Pool pool;
  Pool PStack_e8;
  uint *puVar2;
  
  std::vector<xmrig::Pool,_std::allocator<xmrig::Pool>_>::clear(&this->m_data);
  iVar1 = (*reader->_vptr_IJsonReader[5])(reader,"pools");
  puVar2 = (uint *)CONCAT44(extraout_var,iVar1);
  if (*(short *)((long)puVar2 + 0xe) == 4) {
    object = (Value *)(*(ulong *)(puVar2 + 2) & 0xffffffffffff);
    for (lVar3 = (ulong)*puVar2 << 4; lVar3 != 0; lVar3 = lVar3 + -0x10) {
      if ((object->data_).f.flags == 3) {
        Pool::Pool(&PStack_e8,object);
        if ((PStack_e8.m_url.m_host.m_data != (char *)0x0) && (PStack_e8.m_url.m_port != 0)) {
          std::vector<xmrig::Pool,_std::allocator<xmrig::Pool>_>::emplace_back<xmrig::Pool>
                    (&this->m_data,&PStack_e8);
        }
        Pool::~Pool(&PStack_e8);
      }
      object = object + 1;
    }
    iVar1 = (*reader->_vptr_IJsonReader[8])(reader,"retries",0);
    if (iVar1 - 1U < 1000) {
      this->m_retries = iVar1;
    }
    iVar1 = (*reader->_vptr_IJsonReader[8])(reader,"retry-pause",0);
    if (iVar1 - 1U < 0xe10) {
      this->m_retryPause = iVar1;
    }
  }
  return;
}

Assistant:

void xmrig::Pools::load(const IJsonReader &reader)
{
    m_data.clear();

    const rapidjson::Value &pools = reader.getArray("pools");
    if (!pools.IsArray()) {
        return;
    }

    for (const rapidjson::Value &value : pools.GetArray()) {
        if (!value.IsObject()) {
            continue;
        }

        Pool pool(value);
        if (pool.isValid()) {
            m_data.push_back(std::move(pool));
        }
    }

    setRetries(reader.getInt("retries"));
    setRetryPause(reader.getInt("retry-pause"));
}